

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
set_display_type(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  byte bVar1;
  uint in_ESI;
  
  if ((char)(this->video_).full_clock_ == '\0') {
    bVar1 = *(byte *)((long)&(this->video_).full_clock_ + 1);
    if (((bVar1 & 3) != 0) && ((bVar1 & 3) != 3)) {
      *(byte *)((long)&(this->video_).full_clock_ + 1) =
           ((bVar1 & 0xfc) - ((in_ESI & 0xfffffffe) == 2)) + '\x02';
    }
  }
  return;
}

Assistant:

void hint_is_composite(bool composite) {
			if(high_switches_observed_) {
				return;
			}

			switch(high_switches_ & 3) {
				// Do nothing if a non-CGA card is in use.
				case 0b00:	case 0b11:
					break;

				default:
					high_switches_ &= ~0b11;
					high_switches_ |= composite ? 0b01 : 0b10;
				break;
			}
		}